

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O2

StructMappingInfo *
duckdb::AddFieldToStruct
          (StructMappingInfo *__return_storage_ptr__,LogicalType *type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *column_path,ColumnDefinition *new_field,idx_t depth)

{
  size_type __n;
  pointer ppVar1;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> uVar2;
  bool bVar3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *__x;
  string *psVar4;
  const_reference pvVar5;
  LogicalType *pLVar6;
  ParsedExpression *pPVar7;
  BinderException *pBVar8;
  pointer ppVar9;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var10;
  allocator local_2f9;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_2f8;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_2f0;
  child_list_t<LogicalType> child_list;
  string local_2b0;
  CatalogException local_290;
  LogicalType local_280;
  ErrorData local_268;
  child_list_t<LogicalType> local_1e8;
  child_list_t<LogicalType> local_1c8;
  string local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  StructMappingInfo result;
  
  if (type->id_ != STRUCT) {
    pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&result,
               "Column %s is not a struct - ALTER TABLE can only add fields to structs",
               (allocator *)&local_268);
    pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(column_path,depth);
    ::std::__cxx11::string::string((string *)&local_f0,(string *)pvVar5);
    BinderException::BinderException<std::__cxx11::string>(pBVar8,(string *)&result,&local_f0);
    __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  StructMappingInfo::StructMappingInfo(&result);
  __x = &StructType::GetChildTypes_abi_cxx11_(type)->
         super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ;
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            *)&child_list,__x);
  ppVar1 = child_list.
           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
           .
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __n = depth + 1;
  ppVar9 = child_list.
           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
           .
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(column_path->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(column_path->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 5 == __n) {
    do {
      if (ppVar9 == ppVar1) {
        psVar4 = ColumnDefinition::Name_abi_cxx11_(new_field);
        pLVar6 = ColumnDefinition::Type(new_field);
        ::std::
        vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
        ::emplace_back<std::__cxx11::string_const&,duckdb::LogicalType_const&>
                  ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                    *)&child_list,psVar4,pLVar6);
        local_1c8.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             child_list.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             .
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_1c8.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             child_list.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             .
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_1c8.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             child_list.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             .
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        child_list.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        child_list.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        child_list.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        LogicalType::STRUCT((LogicalType *)&local_268,&local_1c8);
        LogicalType::operator=(&result.new_type,(LogicalType *)&local_268);
        LogicalType::~LogicalType((LogicalType *)&local_268);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                   *)&local_1c8);
        bVar3 = ColumnDefinition::HasDefaultValue(new_field);
        if (bVar3) {
          pPVar7 = ColumnDefinition::DefaultValue(new_field);
          (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[0xc])
                    ((__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                      *)&local_268,pPVar7);
          _Var10._M_head_impl = (ParsedExpression *)local_268._0_8_;
        }
        else {
          pLVar6 = ColumnDefinition::Type(new_field);
          LogicalType::LogicalType(&local_280,pLVar6);
          Value::Value((Value *)&local_268,&local_280);
          make_uniq<duckdb::ConstantExpression,duckdb::Value>
                    ((duckdb *)&local_2b0,(Value *)&local_268);
          _Var10._M_head_impl = (ParsedExpression *)local_2b0._M_dataplus._M_p;
          local_2b0._M_dataplus._M_p = (pointer)0x0;
          Value::~Value((Value *)&local_268);
          LogicalType::~LogicalType(&local_280);
        }
        local_2f0._M_head_impl = _Var10._M_head_impl;
        psVar4 = ColumnDefinition::Name_abi_cxx11_(new_field);
        ::std::__cxx11::string::string((string *)&local_190,(string *)psVar4);
        PackExpression((duckdb *)&local_268,
                       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)&local_2f0,&local_190);
        uVar2 = result.default_value;
        result.default_value.
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
             local_268._0_8_;
        if (uVar2.
            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
            (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)uVar2.
                                super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                                .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>.
                                _M_head_impl + 8))();
        }
        ::std::__cxx11::string::~string((string *)&local_190);
        if (local_2f0._M_head_impl != (ParsedExpression *)0x0) {
          (*((local_2f0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_2f0._M_head_impl = (ParsedExpression *)0x0;
        goto LAB_008a980a;
      }
      psVar4 = ColumnDefinition::Name_abi_cxx11_(new_field);
      bVar3 = StringUtil::CIEquals(&ppVar9->first,psVar4);
      ppVar9 = ppVar9 + 1;
    } while (!bVar3);
    ::std::__cxx11::string::string
              ((string *)&local_2b0,"Duplicate field \"%s\" - field already exists in struct %s",
               &local_2f9);
    psVar4 = ColumnDefinition::Name_abi_cxx11_(new_field);
    ::std::__cxx11::string::string((string *)&local_150,(string *)psVar4);
    pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::back(column_path);
    ::std::__cxx11::string::string((string *)&local_170,(string *)pvVar5);
    CatalogException::CatalogException<std::__cxx11::string,std::__cxx11::string>
              (&local_290,&local_2b0,&local_150,&local_170);
    ErrorData::ErrorData(&local_268,(exception *)&local_290);
    ErrorData::operator=(&result.error,&local_268);
    ErrorData::~ErrorData(&local_268);
    ::std::runtime_error::~runtime_error((runtime_error *)&local_290);
    ::std::__cxx11::string::~string((string *)&local_170);
    ::std::__cxx11::string::~string((string *)&local_150);
    ::std::__cxx11::string::~string((string *)&local_2b0);
  }
  else {
    pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(column_path,__n);
    ppVar1 = child_list.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             .
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar9 = child_list.
                  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  .
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar1; ppVar9 = ppVar9 + 1)
    {
      bVar3 = StringUtil::CIEquals(&ppVar9->first,pvVar5);
      if (bVar3) {
        AddFieldToStruct(__return_storage_ptr__,&ppVar9->second,column_path,new_field,__n);
        if ((__return_storage_ptr__->error).initialized != false) goto LAB_008a981d;
        LogicalType::operator=(&ppVar9->second,&__return_storage_ptr__->new_type);
        local_2f8._M_head_impl =
             (__return_storage_ptr__->default_value).
             super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
        (__return_storage_ptr__->default_value).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (ParsedExpression *)0x0;
        ::std::__cxx11::string::string((string *)&local_1b0,(string *)ppVar9);
        PackExpression((duckdb *)&local_268,
                       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)&local_2f8,&local_1b0);
        uVar2 = result.default_value;
        result.default_value.
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
             local_268._0_8_;
        if (uVar2.
            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
            (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)uVar2.
                                super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                                .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>.
                                _M_head_impl + 8))();
        }
        ::std::__cxx11::string::~string((string *)&local_1b0);
        if (local_2f8._M_head_impl != (ParsedExpression *)0x0) {
          (*((local_2f8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_2f8._M_head_impl = (ParsedExpression *)0x0;
        StructMappingInfo::~StructMappingInfo(__return_storage_ptr__);
        break;
      }
    }
    local_1e8.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         child_list.
         super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
         .
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_1e8.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         child_list.
         super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
         .
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_1e8.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         child_list.
         super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
         .
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    child_list.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    child_list.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    child_list.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LogicalType::STRUCT((LogicalType *)&local_268,&local_1e8);
    LogicalType::operator=(&result.new_type,(LogicalType *)&local_268);
    LogicalType::~LogicalType((LogicalType *)&local_268);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_1e8);
    if (ppVar9 == ppVar1) {
      pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_268,"Sub-field %s does not exist in column %s",
                 (allocator *)&local_2b0);
      ::std::__cxx11::string::string((string *)&local_110,(string *)pvVar5);
      pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(column_path,depth);
      ::std::__cxx11::string::string((string *)&local_130,(string *)pvVar5);
      BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                (pBVar8,(string *)&local_268,&local_110,&local_130);
      __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
LAB_008a980a:
  StructMappingInfo::StructMappingInfo(__return_storage_ptr__,&result);
LAB_008a981d:
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&child_list);
  StructMappingInfo::~StructMappingInfo(&result);
  return __return_storage_ptr__;
}

Assistant:

StructMappingInfo AddFieldToStruct(const LogicalType &type, const vector<string> &column_path,
                                   const ColumnDefinition &new_field, idx_t depth = 0) {
	if (type.id() != LogicalTypeId::STRUCT) {
		throw BinderException("Column %s is not a struct - ALTER TABLE can only add fields to structs",
		                      column_path[depth]);
	}
	StructMappingInfo result;
	auto child_list = StructType::GetChildTypes(type);
	if (column_path.size() == depth + 1) {
		// root path - we are adding at this level
		// check if a field with this name already exists
		for (auto &entry : child_list) {
			if (StringUtil::CIEquals(entry.first, new_field.Name())) {
				// already exists!
				result.error = ErrorData(CatalogException("Duplicate field \"%s\" - field already exists in struct %s",
				                                          new_field.Name(), column_path.back()));
				return result;
			}
		}
		// add the new type
		child_list.emplace_back(new_field.Name(), new_field.Type());
		result.new_type = LogicalType::STRUCT(std::move(child_list));
		// set the default value
		unique_ptr<ParsedExpression> default_value;
		if (new_field.HasDefaultValue()) {
			default_value = new_field.DefaultValue().Copy();
		} else {
			default_value = make_uniq<ConstantExpression>(Value(new_field.Type()));
		}
		result.default_value = PackExpression(std::move(default_value), new_field.Name());
		return result;
	}
	// not the root path - we need to recurse
	auto &next_component = column_path[depth + 1];
	bool found = false;
	for (auto &entry : child_list) {
		if (StringUtil::CIEquals(entry.first, next_component)) {
			// found the entry - recurse
			auto child_res = AddFieldToStruct(entry.second, column_path, new_field, depth + 1);
			if (child_res.error.HasError()) {
				return child_res;
			}
			entry.second = std::move(child_res.new_type);
			result.default_value = PackExpression(std::move(child_res.default_value), entry.first);
			found = true;
			break;
		}
	}
	result.new_type = LogicalType::STRUCT(std::move(child_list));
	if (!found) {
		throw BinderException("Sub-field %s does not exist in column %s", next_component, column_path[depth]);
	}
	return result;
}